

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SorterRecord * vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2)

{
  anon_union_8_2_0134e7e8_for_u *paVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_2_0134e7e8_for_u *paVar4;
  SorterRecord *pSVar5;
  long in_FS_OFFSET;
  SorterRecord *pFinal;
  int bCached;
  anon_union_8_2_0134e7e8_for_u local_40;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar4 = &local_40;
  local_40.pNext = (SorterRecord *)0x0;
  local_34 = 0;
  do {
    iVar3 = (*pTask->xCompare)(pTask,&local_34,p1 + 1,p1->nVal,p2 + 1,p2->nVal);
    if (iVar3 < 1) {
      paVar4->pNext = p1;
      pSVar5 = (p1->u).pNext;
      paVar4 = &p1->u;
      bVar2 = true;
      if (pSVar5 == (SorterRecord *)0x0) {
        paVar4->pNext = p2;
        bVar2 = false;
        pSVar5 = (SorterRecord *)0x0;
      }
    }
    else {
      paVar4->pNext = p2;
      paVar1 = &p2->u;
      paVar4 = &p2->u;
      local_34 = 0;
      bVar2 = true;
      p2 = paVar1->pNext;
      pSVar5 = p1;
      if (paVar1->pNext == (SorterRecord *)0x0) {
        paVar4->pNext = p1;
        p2 = (SorterRecord *)0x0;
        bVar2 = false;
      }
    }
    p1 = pSVar5;
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return local_40.pNext;
}

Assistant:

static SorterRecord *vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2                /* Second list to merge */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  int bCached = 0;

  assert( p1!=0 && p2!=0 );
  for(;;){
    int res;
    res = pTask->xCompare(
        pTask, &bCached, SRVAL(p1), p1->nVal, SRVAL(p2), p2->nVal
    );

    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      if( p1==0 ){
        *pp = p2;
        break;
      }
    }else{
      *pp = p2;
      pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      bCached = 0;
      if( p2==0 ){
        *pp = p1;
        break;
      }
    }
  }
  return pFinal;
}